

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

bool __thiscall
Js::InterpreterStackFrame::CheckAndResetImplicitCall
          (InterpreterStackFrame *this,DisableImplicitFlags prevDisableImplicitFlags,
          ImplicitCallFlags savedImplicitCallFlags)

{
  byte bVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)(this + 0x78) + 0x3b8);
  bVar1 = *(byte *)(lVar2 + 0x1570);
  if (1 < bVar1) {
    *(DisableImplicitFlags *)(lVar2 + 0x1542) = prevDisableImplicitFlags;
    *(ImplicitCallFlags *)(lVar2 + 0x1570) = savedImplicitCallFlags;
  }
  return 1 < bVar1;
}

Assistant:

bool InterpreterStackFrame::CheckAndResetImplicitCall(DisableImplicitFlags prevDisableImplicitFlags, ImplicitCallFlags savedImplicitCallFlags)
    {
        ImplicitCallFlags curImplicitCallFlags = this->scriptContext->GetThreadContext()->GetImplicitCallFlags();
        if (curImplicitCallFlags > ImplicitCall_None)
        {
            //error implicit bit is set , reparse without asmjs
            this->scriptContext->GetThreadContext()->SetDisableImplicitFlags(prevDisableImplicitFlags);
            this->scriptContext->GetThreadContext()->SetImplicitCallFlags(savedImplicitCallFlags);
            return true;
        }
        return false;
    }